

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::anon_unknown_14::operator<<(ostream *os,XmlEncode *xmlEncode)

{
  ostream *in_RDI;
  ostream *in_stack_00000048;
  XmlEncode *in_stack_00000050;
  
  XmlEncode::encodeTo(in_stack_00000050,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::ostream& operator << ( std::ostream& os, XmlEncode const& xmlEncode ) {
        xmlEncode.encodeTo( os );
        return os;
    }